

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::SharedDtor(TreeEnsembleClassifier *this)

{
  ulong uVar1;
  TreeEnsembleParameters *this_00;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x4e2);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  if (this != (TreeEnsembleClassifier *)_TreeEnsembleClassifier_default_instance_) {
    this_00 = this->treeensemble_;
    if (this_00 != (TreeEnsembleParameters *)0x0) {
      TreeEnsembleParameters::~TreeEnsembleParameters(this_00);
    }
    operator_delete(this_00,0x48);
  }
  if (this->_oneof_case_[0] != 0) {
    clear_ClassLabels(this);
  }
  return;
}

Assistant:

inline void TreeEnsembleClassifier::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete treeensemble_;
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}